

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O1

void __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::InvalidateFixedField<Js::JavascriptString*>
          (DictionaryTypeHandlerBase<unsigned_short> *this,DynamicObject *instance,
          JavascriptString *propertyKey,DictionaryPropertyDescriptor<unsigned_short> *descriptor)

{
  Flags FVar1;
  RecyclerWeakReference<Js::DynamicObject> *pRVar2;
  code *pcVar3;
  bool bVar4;
  PropertyId propertyId;
  undefined4 *puVar5;
  
  if (((this->super_DynamicTypeHandler).flags & 0x18) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0xa74,"(!GetIsOrMayBecomeShared())","!GetIsOrMayBecomeShared()");
    if (!bVar4) goto LAB_00db0df0;
    *puVar5 = 0;
  }
  pRVar2 = (this->singletonInstance).ptr;
  if (pRVar2 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
    if ((DynamicObject *)(pRVar2->super_RecyclerWeakReferenceBase).strongRef != instance) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0xa77,"(this->singletonInstance->Get() == instance)",
                                  "this->singletonInstance->Get() == instance");
      if (!bVar4) {
LAB_00db0df0:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar5 = 0;
    }
    FVar1 = descriptor->flags;
    descriptor->flags = FVar1 & ~IsFixed;
    if ((FVar1 & UsedAsFixed) != None) {
      propertyId = DynamicTypeHandler::TMapKey_GetPropertyId
                             ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).
                               ptr)->super_JavascriptLibraryBase).scriptContext.ptr,propertyKey);
      ThreadContext::InvalidatePropertyGuards
                (((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                  super_JavascriptLibraryBase).scriptContext.ptr)->threadContext,propertyId);
      descriptor->flags = descriptor->flags & ~UsedAsFixed;
    }
  }
  return;
}

Assistant:

void DictionaryTypeHandlerBase<T>::InvalidateFixedField(DynamicObject* instance, TPropertyKey propertyKey, DictionaryPropertyDescriptor<T>* descriptor)
    {
        // DictionaryTypeHandlers are never shared, but if they were we would need to invalidate even if
        // there wasn't a singleton instance.  See SimpleDictionaryTypeHandler::InvalidateFixedFields.
        Assert(!GetIsOrMayBecomeShared());
        if (this->singletonInstance != nullptr)
        {
            Assert(this->singletonInstance->Get() == instance);

            // Even if we wrote a new value into this property (overwriting a previously fixed one), we don't
            // consider the new one fixed. This also means that it's ok to populate the inline caches for
            // this property from now on.
            descriptor->SetIsFixed(false);

            if (descriptor->GetUsedAsFixed())
            {
                // Invalidate any JIT-ed code that hard coded this method. No need to invalidate
                // any store field inline caches, because they have never been populated.
                PropertyId propertyId = TMapKey_GetPropertyId(instance->GetScriptContext(), propertyKey);
                instance->GetScriptContext()->GetThreadContext()->InvalidatePropertyGuards(propertyId);
                descriptor->SetUsedAsFixed(false);
            }
        }
    }